

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tp_ssl.c
# Opt level: O1

void symmetric_ssl_main(void)

{
  ushort uVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  agent_type aVar6;
  uint uVar7;
  void *pvVar8;
  SSL *s;
  char *__optval;
  char *__s;
  size_t sVar9;
  request *prVar10;
  timestamp_info *b;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  uint64_t uVar15;
  size_t *psVar16;
  size_t __nmemb;
  ulong uVar17;
  tcp_connection *conn;
  host_tuple *phVar18;
  long in_FS_OFFSET;
  byte_req_pair bVar19;
  sockaddr_in addr;
  int one;
  timespec latency;
  timespec rx_timestamp;
  timespec tx_timestamp;
  sockaddr local_98;
  ulong local_88;
  host_tuple *local_80;
  void *local_78;
  int local_70;
  undefined4 local_6c;
  epoll_event *local_68;
  timespec local_60;
  timespec local_50;
  epoll_event local_40;
  
  local_78 = malloc(0x200);
  local_6c = 1;
  local_98.sa_family = 2;
  iVar3 = epoll_create(1);
  if (iVar3 < 0) {
    symmetric_ssl_main_cold_13();
    return;
  }
  iVar4 = get_conn_count();
  iVar5 = get_thread_count();
  iVar4 = iVar4 / iVar5;
  __nmemb = (size_t)iVar4;
  pvVar8 = calloc(__nmemb,0x4018);
  *(void **)(in_FS_OFFSET + -0x1b0) = pvVar8;
  if (pvVar8 == (void *)0x0) {
    __assert_fail("connections",
                  "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_ssl.c"
                  ,0x74,"int throughput_open_connections(void)");
  }
  aVar6 = get_agent_type();
  if (aVar6 != SYMMETRIC_NIC_TIMESTAMP_AGENT) {
    aVar6 = get_agent_type();
    if (aVar6 != SYMMETRIC_AGENT) goto LAB_0010c120;
  }
  pvVar8 = calloc(__nmemb,0x18);
  *(void **)(in_FS_OFFSET + -0x1c0) = pvVar8;
  if (pvVar8 == (void *)0x0) {
    __assert_fail("per_conn_tx_timestamps",
                  "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_ssl.c"
                  ,0x79,"int throughput_open_connections(void)");
  }
  if (0 < iVar4) {
    lVar13 = 0;
    do {
      iVar5 = get_max_pending_reqs();
      pvVar8 = calloc((long)iVar5,0x18);
      *(void **)(*(long *)(in_FS_OFFSET + -0x1c0) + 0x10 + lVar13) = pvVar8;
      if (pvVar8 == (void *)0x0) {
        __assert_fail("per_conn_tx_timestamps[i].pending",
                      "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_ssl.c"
                      ,0x7d,"int throughput_open_connections(void)");
      }
      lVar13 = lVar13 + 0x18;
    } while (__nmemb * 0x18 != lVar13);
  }
LAB_0010c120:
  local_80 = get_targets();
  local_88 = CONCAT44(local_88._4_4_,iVar3);
  if (0 < iVar4) {
    lVar13 = 0;
    uVar17 = 0;
    do {
      iVar3 = socket(2,1,0);
      if (iVar3 == -1) {
        symmetric_ssl_main_cold_12();
        return;
      }
      iVar5 = get_target_count();
      uVar12 = (long)((ulong)(uint)((int)uVar17 >> 0x1f) << 0x20 | uVar17 & 0xffffffff) %
               (long)iVar5 & 0xffffffff;
      local_98.sa_data._0_2_ = local_80[uVar12].port << 8 | local_80[uVar12].port >> 8;
      local_98.sa_data._2_4_ = local_80[uVar12].ip;
      iVar5 = connect(iVar3,&local_98,0x10);
      if (iVar5 != 0) {
        symmetric_ssl_main_cold_1();
        return;
      }
      lVar11 = *(long *)(in_FS_OFFSET + -0x1b0);
      *(int *)(lVar11 + lVar13) = iVar3;
      *(short *)(lVar11 + 4 + lVar13) = (short)uVar17;
      *(undefined2 *)(lVar11 + 10 + lVar13) = 0;
      *(undefined4 *)(lVar11 + 6 + lVar13) = 0;
      s = SSL_new((SSL_CTX *)ssl_ctx);
      *(SSL **)(lVar11 + 0x4010 + lVar13) = s;
      if (s == (SSL *)0x0) {
        __assert_fail("tls_conn->ssl",
                      "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_ssl.c"
                      ,0x4d,"int ssl_init_connection(struct tls_connection *)");
      }
      iVar5 = SSL_set_fd(s,*(int *)(lVar11 + lVar13));
      if (iVar5 != 1) {
        __assert_fail("err == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_ssl.c"
                      ,0x50,"int ssl_init_connection(struct tls_connection *)");
      }
      iVar5 = SSL_connect(*(SSL **)(lVar11 + 0x4010 + lVar13));
      if (iVar5 < 1) {
        symmetric_ssl_main_cold_2();
      }
      else {
        iVar4 = SSL_is_init_finished(*(undefined8 *)(lVar11 + 0x4010 + lVar13));
        if (iVar4 != 1) goto LAB_0010c953;
      }
      if (iVar5 < 1) {
        return;
      }
      iVar5 = fcntl(iVar3,4,0x800);
      if (iVar5 == -1) {
        symmetric_ssl_main_cold_11();
        return;
      }
      local_60.tv_sec._0_4_ = 0x80000;
      iVar5 = setsockopt(iVar3,1,7,&local_60,4);
      if (iVar5 != 0) {
        symmetric_ssl_main_cold_3();
        return;
      }
      local_60.tv_sec._0_4_ = 0x80000;
      iVar5 = setsockopt(iVar3,1,8,&local_60,4);
      if (iVar5 != 0) {
        symmetric_ssl_main_cold_4();
        return;
      }
      aVar6 = get_agent_type();
      if (aVar6 == SYMMETRIC_NIC_TIMESTAMP_AGENT) {
        __optval = get_if_name();
        __s = get_if_name();
        sVar9 = strlen(__s);
        iVar5 = setsockopt(iVar3,1,0x19,__optval,(socklen_t)sVar9);
        if (iVar5 != 0) {
          symmetric_ssl_main_cold_5();
          return;
        }
        iVar5 = sock_enable_timestamping(iVar3);
        if (iVar5 != 0) {
          symmetric_ssl_main_cold_6();
          return;
        }
      }
      iVar5 = setsockopt(iVar3,6,1,&local_6c,4);
      if (iVar5 != 0) {
        symmetric_ssl_main_cold_7();
        return;
      }
      local_50.tv_sec = 1;
      iVar5 = setsockopt(iVar3,1,0xd,&local_50,8);
      if (iVar5 != 0) {
        symmetric_ssl_main_cold_8();
LAB_0010c953:
        __assert_fail("err == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_ssl.c"
                      ,0x5c,"int ssl_init_connection(struct tls_connection *)");
      }
      local_40.events = 1;
      local_40._4_4_ = (int)uVar17;
      iVar3 = epoll_ctl((int)local_88,1,iVar3,&local_40);
      if (iVar3 != 0) {
        symmetric_ssl_main_cold_9();
        return;
      }
      uVar17 = uVar17 + 1;
      lVar13 = lVar13 + 0x4018;
    } while (__nmemb != uVar17);
  }
  *(int *)(in_FS_OFFSET + -0x1b8) = (int)local_88;
  iVar3 = get_conn_count();
  local_70 = get_thread_count();
  local_70 = iVar3 / local_70;
  local_68 = (epoll_event *)malloc((long)local_70 * 0xc);
  pthread_barrier_wait((pthread_barrier_t *)&conn_open_barrier);
  set_conn_open(1);
  iVar3 = clock_gettime(1,(timespec *)&local_98);
  if (iVar3 != 0) {
LAB_0010c856:
    __assert_fail("r == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/inc/lancet/misc.h"
                  ,0x28,"int64_t time_ns()");
  }
  lVar13 = (long)((double)CONCAT44(local_98.sa_data._2_4_,
                                   CONCAT22(local_98.sa_data._0_2_,local_98.sa_family)) *
                  1000000000.0 + (double)(long)local_98.sa_data._6_8_);
  local_88 = 0x200;
  do {
    iVar3 = should_load();
    if (iVar3 == 0) {
      do {
        iVar3 = clock_gettime(1,(timespec *)&local_98);
        uVar2 = local_98.sa_data._6_8_;
        if (iVar3 != 0) goto LAB_0010c856;
        lVar13 = CONCAT44(local_98.sa_data._2_4_,CONCAT22(local_98.sa_data._0_2_,local_98.sa_family)
                         );
        iVar3 = should_load();
      } while (iVar3 == 0);
      lVar13 = (long)((double)lVar13 * 1000000000.0 + (double)(long)uVar2);
    }
    while( true ) {
      iVar3 = clock_gettime(1,(timespec *)&local_98);
      if (iVar3 != 0) goto LAB_0010c856;
      if ((long)((double)CONCAT44(local_98.sa_data._2_4_,
                                  CONCAT22(local_98.sa_data._0_2_,local_98.sa_family)) *
                 1000000000.0 + (double)(long)local_98.sa_data._6_8_) < lVar13) break;
      uVar7 = *(uint *)(in_FS_OFFSET + -0x1a8);
      *(uint *)(in_FS_OFFSET + -0x1a8) = uVar7 + 1;
      iVar3 = get_conn_count();
      iVar5 = get_thread_count();
      lVar11 = *(long *)(in_FS_OFFSET + -0x1b0);
      lVar14 = (long)(int)((ulong)uVar7 % ((long)iVar3 / (long)iVar5 & 0xffffffffU)) * 0x4018;
      uVar1 = *(ushort *)(lVar11 + 8 + lVar14);
      iVar3 = get_max_pending_reqs();
      if ((iVar3 <= (int)(uint)uVar1) ||
         (phVar18 = (host_tuple *)(lVar11 + lVar14), *(short *)&phVar18->field_0x6 != 0)) {
        phVar18 = (host_tuple *)0x0;
      }
      if (phVar18 == (host_tuple *)0x0) break;
      prVar10 = prepare_request();
      if ((long)prVar10->iov_cnt < 1) {
        iVar3 = 0;
      }
      else {
        lVar11 = 0;
        iVar3 = 0;
        do {
          iVar3 = iVar3 + *(int *)((long)&prVar10->iovs[0].iov_len + lVar11);
          lVar11 = lVar11 + 0x10;
        } while ((long)prVar10->iov_cnt * 0x10 != lVar11);
      }
      uVar17 = (ulong)iVar3;
      pvVar8 = local_78;
      local_80 = phVar18;
      if (local_88 < uVar17) {
        free(local_78);
        pvVar8 = malloc(uVar17);
        local_88 = uVar17;
      }
      local_78 = (void *)uVar17;
      if (prVar10->iov_cnt < 1) {
        uVar17 = 0;
      }
      else {
        psVar16 = &prVar10->iovs[0].iov_len;
        lVar11 = 0;
        uVar17 = 0;
        do {
          memcpy((void *)((long)pvVar8 + uVar17),((iovec *)(psVar16 + -1))->iov_base,*psVar16);
          uVar17 = uVar17 + *psVar16;
          lVar11 = lVar11 + 1;
          psVar16 = psVar16 + 2;
        } while (lVar11 < prVar10->iov_cnt);
      }
      phVar18 = local_80;
      if ((void *)uVar17 != local_78) {
        __assert_fail("copied == bytes_to_send",
                      "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_ssl.c"
                      ,0x11f,"void symmetric_ssl_main(void)");
      }
      local_78 = pvVar8;
      iVar5 = SSL_write((SSL *)local_80[0x802],pvVar8,iVar3);
      if (iVar5 != iVar3) {
        __assert_fail("ret == bytes_to_send",
                      "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_ssl.c"
                      ,0x123,"void symmetric_ssl_main(void)");
      }
      iVar3 = clock_gettime(1,(timespec *)&local_40);
      if (iVar3 != 0) goto LAB_0010c875;
      push_complete_tx_timestamp
                ((pending_tx_timestamps *)
                 ((ulong)((uint)phVar18->port * 0x18) + *(long *)(in_FS_OFFSET + -0x1c0)),
                 (timespec *)&local_40);
      phVar18 = phVar18 + 1;
      *(short *)&phVar18->ip = (short)phVar18->ip + 1;
      bVar19.bytes = (uint64_t)iVar5;
      bVar19.reqs = 1;
      add_throughput_tx_sample(bVar19);
      lVar11 = get_ia();
      lVar13 = lVar13 + lVar11;
    }
    uVar7 = epoll_wait(*(int *)(in_FS_OFFSET + -0x1b8),local_68,local_70,0);
    if (0 < (int)uVar7) {
      local_80 = (host_tuple *)(ulong)uVar7;
      phVar18 = (host_tuple *)0x0;
      do {
        if (((&local_68->events)[(long)phVar18 * 3] & 1) == 0) {
          __assert_fail("events[i].events & EPOLLIN",
                        "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_ssl.c"
                        ,0x13a,"void symmetric_ssl_main(void)");
        }
        conn = (tcp_connection *)
               ((long)*(int *)(&local_68->field_0x4 + (long)phVar18 * 0xc) * 0x4018 +
               *(long *)(in_FS_OFFSET + -0x1b0));
        iVar3 = SSL_read(*(SSL **)&conn[1].idx,conn->buffer + conn->buffer_idx,
                         0x4000 - (uint)conn->buffer_idx);
        if (iVar3 < 1) {
          iVar5 = SSL_get_error(*(SSL **)&conn[1].idx,iVar3);
          if (iVar5 != 2) {
            if (iVar3 != 0) {
              symmetric_ssl_main_cold_10();
              return;
            }
            SSL_shutdown(*(SSL **)&conn[1].idx);
            SSL_free(*(SSL **)&conn[1].idx);
            close(conn->fd);
            conn->closed = 1;
          }
        }
        else {
          iVar5 = clock_gettime(1,&local_50);
          if (iVar5 != 0) {
LAB_0010c875:
            __assert_fail("r == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/inc/lancet/misc.h"
                          ,0x2f,"void time_ns_to_ts(struct timespec *)");
          }
          conn->buffer_idx = conn->buffer_idx + (short)iVar3;
          bVar19 = handle_response(conn);
          uVar15 = bVar19.reqs;
          if (uVar15 != 0) {
            conn->pending_reqs = conn->pending_reqs - (short)bVar19.reqs;
            do {
              b = pop_pending_tx_timestamps
                            ((pending_tx_timestamps *)
                             ((ulong)((uint)conn->idx * 0x18) + *(long *)(in_FS_OFFSET + -0x1c0)));
              if (b == (timestamp_info *)0x0) {
                __assert_fail("pending_tx",
                              "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_ssl.c"
                              ,0x15e,"void symmetric_ssl_main(void)");
              }
              uVar15 = uVar15 - 1;
            } while (uVar15 != 0);
            iVar3 = timespec_diff(&local_60,(timespec *)&local_50,&b->time);
            if (iVar3 != 0) {
              __assert_fail("ret == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_ssl.c"
                            ,0x161,"void symmetric_ssl_main(void)");
            }
            add_latency_sample((long)((double)CONCAT44(local_60.tv_sec._4_4_,
                                                       (undefined4)local_60.tv_sec) * 1000000000.0 +
                                     (double)local_60.tv_nsec),&b->time);
            add_throughput_rx_sample(bVar19);
          }
        }
        phVar18 = (host_tuple *)((long)&phVar18->ip + 1);
      } while (phVar18 != local_80);
    }
  } while( true );
}

Assistant:

static void symmetric_ssl_main(void)
{
	int ready, idx, i, j, conn_per_thread, ret, bytes_to_send;
	long next_tx, copied;
	struct epoll_event *events;
	struct tls_connection *conn;
	struct request *to_send;
	struct byte_req_pair read_res;
	struct byte_req_pair send_res;
	struct timespec tx_timestamp, rx_timestamp, latency;
	struct timestamp_info *pending_tx;
	char *wbuf;
	uint64_t wbuf_size = 512;

	wbuf = malloc(wbuf_size);

	if (throughput_open_connections())
		return;

	/*Initializations*/
	conn_per_thread = get_conn_count() / get_thread_count();
	events = malloc(conn_per_thread * sizeof(struct epoll_event));

	pthread_barrier_wait(&conn_open_barrier);
	set_conn_open(1);

	next_tx = time_ns();
	while (1) {
		if (!should_load()) {
			next_tx = time_ns();
			continue;
		}
		while (time_ns() >= next_tx) {
			conn = pick_conn();
			if (!conn)
				goto REP_PROC;
			to_send = prepare_request();

			bytes_to_send = 0;
			for (i = 0; i < to_send->iov_cnt; i++)
				bytes_to_send += to_send->iovs[i].iov_len;

			if (bytes_to_send > wbuf_size) {
				free(wbuf);
				wbuf = malloc(bytes_to_send);
				wbuf_size = bytes_to_send;
			}

			copied = 0;
			for (i = 0; i < to_send->iov_cnt; i++) {
				memcpy(&wbuf[copied], to_send->iovs[i].iov_base,
					   to_send->iovs[i].iov_len);
				copied += to_send->iovs[i].iov_len;
			}
			assert(copied == bytes_to_send);

			int ret = SSL_write(conn->ssl, wbuf, bytes_to_send);

			assert(ret == bytes_to_send);

			time_ns_to_ts(&tx_timestamp);
			push_complete_tx_timestamp(&per_conn_tx_timestamps[conn->conn.idx],
									   &tx_timestamp);
			conn->conn.pending_reqs++;

			/*BookKeeping*/
			send_res.bytes = ret;
			send_res.reqs = 1;
			add_throughput_tx_sample(send_res);

			/*Schedule next*/
			next_tx += get_ia();
		}

	REP_PROC:
		/* process responses */
		ready = epoll_wait(epoll_fd, events, conn_per_thread, 0);
		for (i = 0; i < ready; i++) {
			idx = events[i].data.u32;
			conn = &connections[idx];
			/* Handle incoming packet */
			assert(events[i].events & EPOLLIN);

			// read into the connection buffer
			ret = SSL_read(conn->ssl, &conn->conn.buffer[conn->conn.buffer_idx],
						   MAX_PAYLOAD - conn->conn.buffer_idx);
			if (ret <= 0) {
				int ssl_err = SSL_get_error(conn->ssl, ret);
				if (ssl_err == SSL_ERROR_WANT_READ)
					continue;

				if (ret == 0) {
					SSL_shutdown(conn->ssl);
					SSL_free(conn->ssl);
					close(conn->conn.fd);
					conn->conn.closed = 1;
					continue;
				}

				lancet_fprintf(stderr, "Unexpected SSL error %d\n", ssl_err);
				return;
			}

			time_ns_to_ts(&rx_timestamp);
			conn->conn.buffer_idx += ret;

			read_res = handle_response(&conn->conn);
			if (read_res.reqs == 0)
				continue;

			conn->conn.pending_reqs -= read_res.reqs;
			/*
			 * Assume only the last request will have an rx timestamp!
			 */
			for (j = 0; j < read_res.reqs; j++) {
				pending_tx = pop_pending_tx_timestamps(
					&per_conn_tx_timestamps[conn->conn.idx]);
				assert(pending_tx);
			}
			ret = timespec_diff(&latency, &rx_timestamp, &pending_tx->time);
			assert(ret == 0);
			long diff = latency.tv_nsec + latency.tv_sec * 1e9;
			add_latency_sample(diff, &pending_tx->time);

			/* Bookkeeping */
			add_throughput_rx_sample(read_res);
		}
	}
}